

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocketPrivate::_q_errorSlot(QSslSocketPrivate *this,SocketError error)

{
  qint64 qVar1;
  SocketError SVar2;
  long lVar3;
  QAbstractSocketPrivate *in_RDI;
  long in_FS_OFFSET;
  qint64 tmpReadBufferMaxSize;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SocketError errorCode;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (**(code **)(*in_RDI[1].super_QAbstractSocketEngineReceiver.
                        _vptr_QAbstractSocketEngineReceiver + 0xa0))();
  if ((lVar3 != 0) && (*(int *)(in_RDI + 1) != 0)) {
    qVar1 = in_RDI->readBufferMaxSize;
    in_RDI->readBufferMaxSize = 0;
    transmit((QSslSocketPrivate *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    in_RDI->readBufferMaxSize = qVar1;
  }
  SVar2 = QAbstractSocket::error((QAbstractSocket *)0x3a6920);
  errorCode = (SocketError)((ulong)local_20 >> 0x20);
  QIODevice::errorString();
  QAbstractSocketPrivate::setErrorAndEmit
            (in_RDI,errorCode,(QString *)CONCAT44(SVar2,in_stack_ffffffffffffffb0));
  QString::~QString((QString *)0x3a695e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::_q_errorSlot(QAbstractSocket::SocketError error)
{
    Q_UNUSED(error);
#ifdef QSSLSOCKET_DEBUG
    Q_Q(QSslSocket);
    qCDebug(lcSsl) << "QSslSocket::_q_errorSlot(" << error << ')';
    qCDebug(lcSsl) << "\tstate =" << q->state();
    qCDebug(lcSsl) << "\terrorString =" << q->errorString();
#endif
    // this moves encrypted bytes from plain socket into our buffer
    if (plainSocket->bytesAvailable() && mode != QSslSocket::UnencryptedMode) {
        qint64 tmpReadBufferMaxSize = readBufferMaxSize;
        readBufferMaxSize = 0; // reset temporarily so the plain sockets completely drained drained
        transmit();
        readBufferMaxSize = tmpReadBufferMaxSize;
    }

    setErrorAndEmit(plainSocket->error(), plainSocket->errorString());
}